

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O3

string * __thiscall
upb::generator::GetModeInit_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,upb_MiniTableField *field32,
          upb_MiniTableField *field64)

{
  generator gVar1;
  uint *field64_00;
  string local_d8;
  AlphaNum local_b8;
  AlphaNum local_88;
  AlphaNum local_58;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  gVar1 = this[0xb];
  field64_00 = &switchD_00279da7::switchdataD_0039af7c;
  switch((byte)gVar1 & 3) {
  case 0:
    field64_00 = (uint *)"(int)kUpb_FieldMode_Map";
    break;
  case 1:
    field64_00 = (uint *)"(int)kUpb_FieldMode_Array";
    break;
  case 2:
    field64_00 = (uint *)"(int)kUpb_FieldMode_Scalar";
    break;
  case 3:
    goto switchD_00279da7_caseD_3;
  }
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)field64_00);
switchD_00279da7_caseD_3:
  if (((byte)gVar1 & 4) != 0) {
    local_b8.piece_._M_len = 0x20;
    local_b8.piece_._M_str = " | (int)kUpb_LabelFlags_IsPacked";
    absl::lts_20250127::StrAppend(__return_storage_ptr__,&local_b8);
  }
  if (((byte)gVar1 & 8) != 0) {
    local_b8.piece_._M_len = 0x23;
    local_b8.piece_._M_str = " | (int)kUpb_LabelFlags_IsExtension";
    absl::lts_20250127::StrAppend(__return_storage_ptr__,&local_b8);
  }
  if (((byte)gVar1 & 0x10) != 0) {
    local_b8.piece_._M_len = 0x23;
    local_b8.piece_._M_str = " | (int)kUpb_LabelFlags_IsAlternate";
    absl::lts_20250127::StrAppend(__return_storage_ptr__,&local_b8);
  }
  local_b8.piece_._M_len = 9;
  local_b8.piece_._M_str = " | ((int)";
  GetFieldRep_abi_cxx11_(&local_d8,this,field32,(upb_MiniTableField *)field64_00);
  local_58.piece_._M_len = local_d8._M_string_length;
  local_58.piece_._M_str = local_d8._M_dataplus._M_p;
  local_88.piece_._M_len = 0x18;
  local_88.piece_._M_str = " << kUpb_FieldRep_Shift)";
  absl::lts_20250127::StrAppend(__return_storage_ptr__,&local_b8,&local_58,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetModeInit(const upb_MiniTableField* field32,
                        const upb_MiniTableField* field64) {
  std::string ret;
  uint8_t mode32 = field32->UPB_PRIVATE(mode);
  switch (mode32 & kUpb_FieldMode_Mask) {
    case kUpb_FieldMode_Map:
      ret = "(int)kUpb_FieldMode_Map";
      break;
    case kUpb_FieldMode_Array:
      ret = "(int)kUpb_FieldMode_Array";
      break;
    case kUpb_FieldMode_Scalar:
      ret = "(int)kUpb_FieldMode_Scalar";
      break;
    default:
      break;
  }

  if (mode32 & kUpb_LabelFlags_IsPacked) {
    absl::StrAppend(&ret, " | (int)kUpb_LabelFlags_IsPacked");
  }

  if (mode32 & kUpb_LabelFlags_IsExtension) {
    absl::StrAppend(&ret, " | (int)kUpb_LabelFlags_IsExtension");
  }

  if (mode32 & kUpb_LabelFlags_IsAlternate) {
    absl::StrAppend(&ret, " | (int)kUpb_LabelFlags_IsAlternate");
  }

  absl::StrAppend(&ret, " | ((int)", GetFieldRep(field32, field64),
                  " << kUpb_FieldRep_Shift)");
  return ret;
}